

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::Operation::InternalSwap(Operation *this,Operation *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *default_value;
  Arena *rhs_arena;
  Arena *lhs_arena;
  Operation *other_local;
  Operation *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::InternalSwap(&this->inputs_,&other->inputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::InternalSwap
            (&this->outputs_,&other->outputs_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::InternalSwap
            (&this->blocks_,&other->blocks_);
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::MILSpec::Operation_AttributesEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  ::InternalSwap(&this->attributes_,&other->attributes_);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (default_value,&this->type_,rhs_arena_00,&other->type_,lhs_arena_00);
  return;
}

Assistant:

void Operation::InternalSwap(Operation* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  inputs_.InternalSwap(&other->inputs_);
  outputs_.InternalSwap(&other->outputs_);
  blocks_.InternalSwap(&other->blocks_);
  attributes_.InternalSwap(&other->attributes_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &type_, lhs_arena,
      &other->type_, rhs_arena
  );
}